

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::splat<(wasm::Type::BasicType)2,8>(Literal *__return_storage_ptr__,wasm *this,Literal *val)

{
  long lVar1;
  Literal *this_00;
  undefined1 local_e8 [8];
  LaneArray<8> lanes;
  
  if (*(long *)(this + 0x10) == 2) {
    lVar1 = 0;
    memset(local_e8,0,0xc0);
    do {
      this_00 = (Literal *)(local_e8 + lVar1);
      if (this_00 != (Literal *)this) {
        Literal::~Literal(this_00);
        Literal::Literal(this_00,(Literal *)this);
      }
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0xc0);
    Literal::Literal(__return_storage_ptr__,(LaneArray<8> *)local_e8);
    lVar1 = 0xa8;
    do {
      Literal::~Literal((Literal *)(local_e8 + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Ty",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x71a,"Literal wasm::splat(const Literal &) [Ty = wasm::Type::i32, Lanes = 8]");
}

Assistant:

static Literal splat(const Literal& val) {
  assert(val.type == Ty);
  LaneArray<Lanes> lanes;
  lanes.fill(val);
  return Literal(lanes);
}